

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O1

int deqp::egl::SurfaceConfig::getColorBufferTypeRank(EGLenum type)

{
  int iVar1;
  TestError *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  code *local_30;
  EGLenum local_28;
  
  if (type == 0x308e) {
    iVar1 = 0;
  }
  else if (type == 0x3300) {
    iVar1 = 2;
  }
  else {
    if (type != 0x308f) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Unknown color buffer type: ","");
      local_30 = eglu::getColorBufferTypeName;
      local_28 = type;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_30);
      std::operator+(&local_50,&local_90,&local_70);
      tcu::TestError::TestError
                (this,local_50._M_dataplus._M_p,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                 ,0x70);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int getColorBufferTypeRank (EGLenum type)
	{
		switch (type)
		{
			case EGL_RGB_BUFFER:			return 0;
			case EGL_LUMINANCE_BUFFER:		return 1;
			case EGL_YUV_BUFFER_EXT:		return 2;
			default:
				TCU_THROW(TestError, (std::string("Unknown color buffer type: ") + eglu::getColorBufferTypeStr(type).toString()).c_str());
		}
	}